

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O1

int Fx_ManDivFindCubeFree(Vec_Int_t *vArr1,Vec_Int_t *vArr2,Vec_Int_t *vCubeFree,int *fWarning)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  char *__s;
  int *piVar10;
  int *piVar11;
  
  piVar10 = vArr1->pArray + 1;
  piVar11 = vArr2->pArray + 1;
  iVar6 = vArr1->nSize;
  piVar1 = vArr1->pArray + iVar6;
  iVar8 = vArr2->nSize;
  piVar2 = vArr2->pArray + iVar8;
  vCubeFree->nSize = 0;
  if (iVar8 < 2 || (long)iVar6 < 2) {
    iVar8 = 1;
    iVar7 = 0;
    iVar6 = 0;
  }
  else {
    iVar6 = 0;
    iVar8 = 1;
    iVar7 = 0;
    do {
      iVar9 = *piVar10;
      iVar3 = *piVar11;
      if (iVar9 == iVar3) {
        piVar10 = piVar10 + 1;
        piVar11 = piVar11 + 1;
        iVar7 = iVar7 + 1;
      }
      else {
        if (iVar9 < iVar3) {
          if (iVar9 < 0) goto LAB_00259f0d;
          piVar10 = piVar10 + 1;
          iVar9 = iVar6 + iVar9 * 2;
        }
        else {
          if (iVar3 < 0) goto LAB_00259f0d;
          piVar11 = piVar11 + 1;
          if (vCubeFree->nSize == 0) {
            iVar8 = 0;
            iVar6 = 1;
          }
          iVar9 = iVar8 + iVar3 * 2;
        }
        Vec_IntPush(vCubeFree,iVar9);
      }
    } while ((piVar10 < piVar1) && (piVar11 < piVar2));
  }
  for (; piVar10 < piVar1; piVar10 = piVar10 + 1) {
    if (*piVar10 < 0) goto LAB_00259f0d;
    Vec_IntPush(vCubeFree,iVar6 + *piVar10 * 2);
  }
  for (; piVar11 < piVar2; piVar11 = piVar11 + 1) {
    if (*piVar11 < 0) {
LAB_00259f0d:
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                    ,0x10b,"int Abc_Var2Lit(int, int)");
    }
    Vec_IntPush(vCubeFree,iVar8 + *piVar11 * 2);
  }
  iVar6 = vCubeFree->nSize;
  if (iVar6 == 2) {
    uVar4 = *vCubeFree->pArray;
    if (((int)uVar4 < 0) || (uVar5 = vCubeFree->pArray[1], (int)uVar5 < 0)) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                    ,0x10c,"int Abc_Lit2Var(int)");
    }
    if (((uVar5 ^ uVar4) < 4) && (*fWarning == 0)) {
      puts(
          "The SOP has distance-1 cubes or it is not a prime cover.  Please make sure the result verifies."
          );
      *fWarning = 1;
    }
  }
  else {
    if (iVar6 == 1) {
      __s = "The SOP has contained cubes.";
    }
    else {
      if (iVar6 != 0) goto LAB_00259e91;
      __s = "The SOP has duplicated cubes.";
    }
    puts(__s);
  }
LAB_00259e91:
  if (vCubeFree->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  if (-1 < *vCubeFree->pArray) {
    if ((*vCubeFree->pArray & 1U) != 0) {
      __assert_fail("!Abc_LitIsCompl(Vec_IntEntry(vCubeFree, 0))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                    ,0x29d,"int Fx_ManDivFindCubeFree(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int *)"
                   );
    }
    return iVar7;
  }
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                ,0x10d,"int Abc_LitIsCompl(int)");
}

Assistant:

int Fx_ManDivFindCubeFree( Vec_Int_t * vArr1, Vec_Int_t * vArr2, Vec_Int_t * vCubeFree, int * fWarning )
{
    int * pBeg1 = vArr1->pArray + 1;  // skip variable ID
    int * pBeg2 = vArr2->pArray + 1;  // skip variable ID
    int * pEnd1 = vArr1->pArray + vArr1->nSize;
    int * pEnd2 = vArr2->pArray + vArr2->nSize;
    int Counter = 0, fAttr0 = 0, fAttr1 = 1;
    Vec_IntClear( vCubeFree );
    while ( pBeg1 < pEnd1 && pBeg2 < pEnd2 )
    {
        if ( *pBeg1 == *pBeg2 )
            pBeg1++, pBeg2++, Counter++;
        else if ( *pBeg1 < *pBeg2 )
            Vec_IntPush( vCubeFree, Abc_Var2Lit(*pBeg1++, fAttr0) );
        else  
        {
            if ( Vec_IntSize(vCubeFree) == 0 )
                fAttr0 = 1, fAttr1 = 0;
            Vec_IntPush( vCubeFree, Abc_Var2Lit(*pBeg2++, fAttr1) );
        }
    }
    while ( pBeg1 < pEnd1 )
        Vec_IntPush( vCubeFree, Abc_Var2Lit(*pBeg1++, fAttr0) );
    while ( pBeg2 < pEnd2 )
        Vec_IntPush( vCubeFree, Abc_Var2Lit(*pBeg2++, fAttr1) );
    if ( Vec_IntSize(vCubeFree) == 0 )
        printf( "The SOP has duplicated cubes.\n" );
    else if ( Vec_IntSize(vCubeFree) == 1 )
        printf( "The SOP has contained cubes.\n" );
    else if ( Vec_IntSize(vCubeFree) == 2 && Abc_Lit2Var(Abc_Lit2Var(Vec_IntEntry(vCubeFree, 0))) == Abc_Lit2Var(Abc_Lit2Var(Vec_IntEntry(vCubeFree, 1))) && !*fWarning )
        printf( "The SOP has distance-1 cubes or it is not a prime cover.  Please make sure the result verifies.\n" ), *fWarning = 1;
    assert( !Abc_LitIsCompl(Vec_IntEntry(vCubeFree, 0)) );
    return Counter;
}